

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

double __thiscall soplex::SPxLPBase<double>::objUnscaled(SPxLPBase<double> *this,int i)

{
  SPxSense SVar1;
  double *pdVar2;
  uint in_ESI;
  SPxLPBase<double> *in_RDI;
  double extraout_XMM0_Qa;
  double res;
  int in_stack_ffffffffffffffdc;
  double local_18;
  
  if ((in_RDI->_isScaled & 1U) == 0) {
    pdVar2 = maxObj(in_RDI,in_stack_ffffffffffffffdc);
    local_18 = *pdVar2;
  }
  else {
    (*in_RDI->lp_scaler->_vptr_SPxScaler[0x18])(in_RDI->lp_scaler,in_RDI,(ulong)in_ESI);
    local_18 = extraout_XMM0_Qa;
  }
  SVar1 = spxSense(in_RDI);
  if (SVar1 == MINIMIZE) {
    local_18 = local_18 * -1.0;
  }
  return local_18;
}

Assistant:

R SPxLPBase<R>::objUnscaled(int i) const
{
   assert(i >= 0 && i < nCols());
   R res;

   if(_isScaled)
   {
      res = lp_scaler->maxObjUnscaled(*this, i);
   }
   else
   {
      res = maxObj(i);
   }

   if(spxSense() == MINIMIZE)
      res *= -1;

   return res;
}